

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::PrepareBlockFilterRequest
          (PeerManagerImpl *this,CNode *node,Peer *peer,BlockFilterType filter_type,
          uint32_t start_height,uint256 *stop_hash,uint32_t max_height_diff,CBlockIndex **stop_index
          ,BlockFilterIndex **filter_index)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  PeerManagerImpl *this_00;
  BlockFilterIndex *pBVar2;
  char in_CL;
  long in_RDX;
  ConstevalFormatString<3U> in_RSI;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  bool bVar3;
  uint in_stack_00000008;
  long *in_stack_00000010;
  long *in_stack_00000018;
  bool supported_filter_type;
  uint32_t stop_height;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock72;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  base_blob<256U> *in_stack_fffffffffffffe20;
  uint256 *in_stack_fffffffffffffe30;
  BlockManager *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  undefined5 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4d;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int iVar4;
  undefined8 in_stack_fffffffffffffe88;
  int source_line;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *pUVar5;
  undefined7 in_stack_fffffffffffffed8;
  byte in_stack_fffffffffffffedf;
  string_view in_stack_fffffffffffffee0;
  Level in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  uint *in_stack_ffffffffffffffe0;
  
  source_line = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = false;
  if (in_CL == '\0') {
    bVar3 = (*(ulong *)(in_RDX + 8) & 0x40) != 0;
  }
  if (bVar3) {
    pUVar5 = in_RDI;
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (in_RDI,in_stack_fffffffffffffe50,
               (char *)CONCAT17(in_stack_fffffffffffffe4f,
                                CONCAT16(in_stack_fffffffffffffe4e,
                                         CONCAT15(in_stack_fffffffffffffe4d,
                                                  in_stack_fffffffffffffe48))),
               in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe38 >> 0x18,0));
    this_00 = (PeerManagerImpl *)
              ::node::BlockManager::LookupBlockIndex
                        (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    *in_stack_00000010 = (long)this_00;
    if ((*in_stack_00000010 == 0) ||
       (bVar3 = BlockRequestAllowed(this_00,(CBlockIndex *)
                                            CONCAT17(in_stack_fffffffffffffe4f,
                                                     CONCAT16(in_stack_fffffffffffffe4e,
                                                              CONCAT15(in_stack_fffffffffffffe4d,
                                                                       in_stack_fffffffffffffe48))))
       , !bVar3)) {
      bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                                  Trace);
      if (bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38,
                   (char *)in_stack_fffffffffffffe30);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38,
                   (char *)in_stack_fffffffffffffe30);
        source_line = 0;
        CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffe20);
        in_stack_fffffffffffffe30 = (uint256 *)&stack0xffffffffffffffd0;
        in_stack_fffffffffffffe18 = 1;
        source_file_00._M_str._0_7_ = in_stack_fffffffffffffed8;
        source_file_00._M_len = (size_t)pUVar5;
        source_file_00._M_str._7_1_ = in_stack_fffffffffffffedf;
        LogPrintFormatInternal<long,std::__cxx11::string>
                  (in_stack_fffffffffffffee0,source_file_00,source_line,
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_ffffffffffffffc0,(ConstevalFormatString<2U>)in_RSI.fmt,
                   (long *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      }
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),false
                );
      in_stack_fffffffffffffedf = 0;
      iVar4 = 1;
    }
    else {
      iVar4 = 0;
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    if (iVar4 == 0) {
      if (*(uint *)(*in_stack_00000010 + 0x18) < in_R8D) {
        bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                                    Trace);
        if (bVar3) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38,
                     (char *)in_stack_fffffffffffffe30);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38,
                     (char *)in_stack_fffffffffffffe30);
          CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          in_stack_fffffffffffffe18 = 1;
          source_file_01._M_str._0_7_ = in_stack_fffffffffffffed8;
          source_file_01._M_len = (size_t)pUVar5;
          source_file_01._M_str._7_1_ = in_stack_fffffffffffffedf;
          LogPrintFormatInternal<long,unsigned_int,unsigned_int>
                    (in_stack_fffffffffffffee0,source_file_01,source_line,
                     CONCAT44(iVar4,in_stack_fffffffffffffe80),in_stack_ffffffffffffffc0,in_RSI,
                     (long *)in_stack_ffffffffffffffd0,(uint *)in_stack_ffffffffffffffd8,
                     in_stack_ffffffffffffffe0);
        }
        std::atomic<bool>::operator=
                  ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   false);
        in_stack_fffffffffffffedf = 0;
      }
      else if (*(uint *)(*in_stack_00000010 + 0x18) - in_R8D < in_stack_00000008) {
        pBVar2 = GetBlockFilterIndex((BlockFilterType)((ulong)in_stack_fffffffffffffe38 >> 0x38));
        *in_stack_00000018 = (long)pBVar2;
        if (*in_stack_00000018 == 0) {
          bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                                      Trace);
          if (bVar3) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38
                       ,(char *)in_stack_fffffffffffffe30);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38
                       ,(char *)in_stack_fffffffffffffe30);
            BlockFilterTypeName_abi_cxx11_
                      ((BlockFilterType)((ulong)in_stack_fffffffffffffe38 >> 0x38));
            source_file_03._M_str._0_7_ = in_stack_fffffffffffffed8;
            source_file_03._M_len = (size_t)pUVar5;
            source_file_03._M_str._7_1_ = in_stack_fffffffffffffedf;
            LogPrintFormatInternal<std::__cxx11::string>
                      (in_stack_fffffffffffffee0,source_file_03,source_line,
                       CONCAT44(iVar4,in_stack_fffffffffffffe80),in_stack_ffffffffffffffc0,
                       (ConstevalFormatString<1U>)in_RSI.fmt,in_stack_ffffffffffffffd0);
          }
          in_stack_fffffffffffffedf = 0;
        }
        else {
          in_stack_fffffffffffffedf = 1;
        }
      }
      else {
        bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                                    Trace);
        if (bVar3) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38,
                     (char *)in_stack_fffffffffffffe30);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38,
                     (char *)in_stack_fffffffffffffe30);
          CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          in_stack_fffffffffffffe18 = 1;
          source_file_02._M_str._0_7_ = in_stack_fffffffffffffed8;
          source_file_02._M_len = (size_t)pUVar5;
          source_file_02._M_str._7_1_ = in_stack_fffffffffffffedf;
          LogPrintFormatInternal<long,unsigned_int,unsigned_int>
                    (in_stack_fffffffffffffee0,source_file_02,source_line,
                     CONCAT44(iVar4,in_stack_fffffffffffffe80),in_stack_ffffffffffffffc0,in_RSI,
                     (long *)in_stack_ffffffffffffffd0,(uint *)in_stack_ffffffffffffffd8,
                     in_stack_ffffffffffffffe0);
        }
        std::atomic<bool>::operator=
                  ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   false);
        in_stack_fffffffffffffedf = 0;
      }
    }
  }
  else {
    bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),Trace)
    ;
    if (bVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38,
                 (char *)in_stack_fffffffffffffe30);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38,
                 (char *)in_stack_fffffffffffffe30);
      CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      in_stack_fffffffffffffe18 = 1;
      source_file._M_str._0_7_ = in_stack_fffffffffffffed8;
      source_file._M_len = (size_t)in_RDI;
      source_file._M_str._7_1_ = in_stack_fffffffffffffedf;
      LogPrintFormatInternal<long,unsigned_char>
                (in_stack_fffffffffffffee0,source_file,source_line,
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_ffffffffffffffc0,(ConstevalFormatString<2U>)in_RSI.fmt,
                 (long *)in_stack_ffffffffffffffd0,(uchar *)in_stack_ffffffffffffffd8);
    }
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),false);
    in_stack_fffffffffffffedf = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(in_stack_fffffffffffffedf & 1);
}

Assistant:

bool PeerManagerImpl::PrepareBlockFilterRequest(CNode& node, Peer& peer,
                                                BlockFilterType filter_type, uint32_t start_height,
                                                const uint256& stop_hash, uint32_t max_height_diff,
                                                const CBlockIndex*& stop_index,
                                                BlockFilterIndex*& filter_index)
{
    const bool supported_filter_type =
        (filter_type == BlockFilterType::BASIC &&
         (peer.m_our_services & NODE_COMPACT_FILTERS));
    if (!supported_filter_type) {
        LogDebug(BCLog::NET, "peer %d requested unsupported block filter type: %d\n",
                 node.GetId(), static_cast<uint8_t>(filter_type));
        node.fDisconnect = true;
        return false;
    }

    {
        LOCK(cs_main);
        stop_index = m_chainman.m_blockman.LookupBlockIndex(stop_hash);

        // Check that the stop block exists and the peer would be allowed to fetch it.
        if (!stop_index || !BlockRequestAllowed(stop_index)) {
            LogDebug(BCLog::NET, "peer %d requested invalid block hash: %s\n",
                     node.GetId(), stop_hash.ToString());
            node.fDisconnect = true;
            return false;
        }
    }

    uint32_t stop_height = stop_index->nHeight;
    if (start_height > stop_height) {
        LogDebug(BCLog::NET, "peer %d sent invalid getcfilters/getcfheaders with "
                 "start height %d and stop height %d\n",
                 node.GetId(), start_height, stop_height);
        node.fDisconnect = true;
        return false;
    }
    if (stop_height - start_height >= max_height_diff) {
        LogDebug(BCLog::NET, "peer %d requested too many cfilters/cfheaders: %d / %d\n",
                 node.GetId(), stop_height - start_height + 1, max_height_diff);
        node.fDisconnect = true;
        return false;
    }

    filter_index = GetBlockFilterIndex(filter_type);
    if (!filter_index) {
        LogDebug(BCLog::NET, "Filter index for supported type %s not found\n", BlockFilterTypeName(filter_type));
        return false;
    }

    return true;
}